

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_sde.c
# Opt level: O1

err_t beltSDEDecr(void *dest,void *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  blob_t state;
  err_t eVar2;
  belt_sde_st *st;
  
  eVar2 = 0x6d;
  if (((0x1f < count && (count & 0xf) == 0) && (len < 0x21)) &&
     ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src,count);
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(iv,0x10);
        if (bVar1 != 0) {
          bVar1 = memIsValid(dest,count);
          if (bVar1 != 0) {
            state = blobCreate(0x58);
            if (state == (blob_t)0x0) {
              eVar2 = 0x6e;
            }
            else {
              beltWBLStart(state,key,len);
              memMove(dest,src,count);
              beltSDEStepD(dest,count,iv,state);
              blobClose(state);
              eVar2 = 0;
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltSDEDecr(void* dest, const void* src, size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count % 16 != 0 || count < 32 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltSDE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// расшифровать
	beltSDEStart(state, key, len);
	memMove(dest, src, count);
	beltSDEStepD(dest, count, iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}